

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Detail::Approx::setEpsilon(Approx *this,double newEpsilon)

{
  ReusableStringStream local_40;
  string local_28;
  
  if ((0.0 <= newEpsilon) && (newEpsilon <= 1.0)) {
    this->m_epsilon = newEpsilon;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_40);
  std::operator<<(local_40.m_oss,"Invalid Approx::epsilon: ");
  std::ostream::_M_insert<double>(newEpsilon);
  std::operator<<(local_40.m_oss,'.');
  std::operator<<(local_40.m_oss," Approx::epsilon has to be in [0, 1]");
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_28);
}

Assistant:

void Approx::setEpsilon(double newEpsilon) {
        CATCH_ENFORCE(newEpsilon >= 0 && newEpsilon <= 1.0,
            "Invalid Approx::epsilon: " << newEpsilon << '.'
            << " Approx::epsilon has to be in [0, 1]");
        m_epsilon = newEpsilon;
    }